

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O2

ares_bool_t timeval_expired(ares_timeval_t *tv,ares_timeval_t *now,unsigned_long millsecs)

{
  ares_timeval_t tvdiff;
  ares_timeval_t local_20;
  
  ares_timeval_diff(&local_20,tv,now);
  return (ares_bool_t)((long)millsecs <= (long)((ulong)local_20.usec / 1000 + local_20.sec * 1000));
}

Assistant:

static ares_bool_t timeval_expired(const ares_timeval_t *tv,
                                   const ares_timeval_t *now,
                                   unsigned long         millsecs)
{
  ares_int64_t   tvdiff_ms;
  ares_timeval_t tvdiff;
  ares_timeval_diff(&tvdiff, tv, now);

  tvdiff_ms = tvdiff.sec * 1000 + tvdiff.usec / 1000;
  if (tvdiff_ms >= (ares_int64_t)millsecs) {
    return ARES_TRUE;
  }
  return ARES_FALSE;
}